

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

void Omega_h::binary::read_array<int>
               (istream *stream,Read<int> *array,bool is_compressed,bool needs_swapping)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  undefined7 in_register_00000009;
  pointer __n;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  char *pcVar5;
  long lVar6;
  uLong dest_bytes;
  HostWrite<int> uncompressed;
  I64 compressed_bytes;
  LO size;
  long local_90;
  Write<int> local_88;
  string local_78;
  Write<int> local_58;
  Write<int> local_48;
  int local_34;
  
  __n = (pointer)CONCAT71(in_register_00000009,needs_swapping);
  read_value<int>(stream,&local_34,needs_swapping);
  if ((long)local_34 < 0) {
    fail("assertion %s failed at %s +%d\n","size >= 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
         ,0x9b);
  }
  std::__cxx11::string::string((string *)&local_78,"",(allocator *)&local_90);
  HostWrite<int>::HostWrite((HostWrite<int> *)&local_88,local_34,&local_78);
  lVar6 = (long)local_34 * 4;
  std::__cxx11::string::~string((string *)&local_78);
  if (is_compressed) {
    read_value<long>(stream,(long *)&local_78,needs_swapping);
    if ((long)local_78._M_dataplus._M_p < 0) {
      fail("assertion %s failed at %s +%d\n","compressed_bytes >= 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0xa3);
    }
    pvVar2 = operator_new__((ulong)local_78._M_dataplus._M_p);
    std::istream::read((char *)stream,(long)pvVar2);
    local_90 = lVar6;
    piVar3 = HostWrite<int>::data((HostWrite<int> *)&local_88);
    piVar3 = nonnull<int>(piVar3);
    iVar1 = uncompress(piVar3,&local_90,pvVar2);
    if (iVar1 == 0) {
      if (local_90 == lVar6) {
        operator_delete__(pvVar2);
        __n = local_78._M_dataplus._M_p;
        pvVar2 = extraout_RDX;
        goto LAB_0028f66d;
      }
      uVar4 = 0xad;
      pcVar5 = "dest_bytes == static_cast<uLong>(uncompressed_bytes)";
    }
    else {
      uVar4 = 0xac;
      pcVar5 = "ret == Z_OK";
    }
    fail("assertion %s failed at %s +%d\n",pcVar5,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
         ,uVar4);
  }
  piVar3 = HostWrite<int>::data((HostWrite<int> *)&local_88);
  piVar3 = nonnull<int>(piVar3);
  std::istream::read((char *)stream,(long)piVar3);
  pvVar2 = extraout_RDX_00;
LAB_0028f66d:
  HostWrite<int>::write((HostWrite<int> *)&local_58,(int)&local_88,pvVar2,(size_t)__n);
  Read<int>::Read((Read<signed_char> *)&local_48,&local_58);
  swap_bytes<int>((binary *)&local_78,(Read<int> *)&local_48,needs_swapping);
  Write<int>::operator=(&array->write_,(Write<int> *)&local_78);
  Write<int>::~Write((Write<int> *)&local_78);
  Write<int>::~Write(&local_48);
  Write<int>::~Write(&local_58);
  Write<int>::~Write(&local_88);
  return;
}

Assistant:

void read_array(std::istream& stream, Read<T>& array, bool is_compressed,
    bool needs_swapping) {
  LO size;
  read_value(stream, size, needs_swapping);
  OMEGA_H_CHECK(size >= 0);
  I64 uncompressed_bytes =
      static_cast<I64>(static_cast<std::size_t>(size) * sizeof(T));
  HostWrite<T> uncompressed(size);
#ifdef OMEGA_H_USE_ZLIB
  if (is_compressed) {
    I64 compressed_bytes;
    read_value(stream, compressed_bytes, needs_swapping);
    OMEGA_H_CHECK(compressed_bytes >= 0);
    auto compressed = new ::Bytef[compressed_bytes];
    stream.read(reinterpret_cast<char*>(compressed), compressed_bytes);
    uLong dest_bytes = static_cast<uLong>(uncompressed_bytes);
    uLong source_bytes = static_cast<uLong>(compressed_bytes);
    ::Bytef* uncompressed_ptr =
        reinterpret_cast< ::Bytef*>(nonnull(uncompressed.data()));
    int ret =
        ::uncompress(uncompressed_ptr, &dest_bytes, compressed, source_bytes);
    OMEGA_H_CHECK(ret == Z_OK);
    OMEGA_H_CHECK(dest_bytes == static_cast<uLong>(uncompressed_bytes));
    delete[] compressed;
  } else
#else
  OMEGA_H_CHECK(is_compressed == false);
#endif
  {
    stream.read(reinterpret_cast<char*>(nonnull(uncompressed.data())),
        uncompressed_bytes);
  }
  array = swap_bytes(Read<T>(uncompressed.write()), needs_swapping);
}